

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GetProcAddressCoreFunctionsCase::executeTest(GetProcAddressCoreFunctionsCase *this)

{
  bool bVar1;
  uint uVar2;
  deUint32 err;
  Library *egl;
  MessageBuilder *pMVar3;
  FunctionNames FVar4;
  MessageBuilder local_990;
  MessageBuilder local_810;
  __eglMustCastToProperFunctionPointerType local_690;
  _func_void *funcPtr;
  char *funcName;
  undefined1 local_678 [4];
  int funcNdx;
  ConfigAttribValueFmt local_4f8;
  MessageBuilder local_4f0;
  MessageBuilder local_370;
  char *local_1f0;
  MessageBuilder local_1e8;
  int local_68;
  FunctionNames funcNames;
  bool apiSupported;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  TestLog *pTStack_18;
  bool funcPtrSupported;
  TestLog *log;
  GetProcAddressCoreFunctionsCase *this_local;
  
  log = (TestLog *)this;
  pTStack_18 = tcu::TestContext::getLog
                         ((this->super_GetProcAddressCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"EGL_KHR_get_all_proc_addresses",&local_41);
  bVar1 = GetProcAddressCase::isSupported(&this->super_GetProcAddressCase,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_19 = bVar1;
  egl = EglTestContext::getLibrary((this->super_GetProcAddressCase).super_TestCase.m_eglTestCtx);
  uVar2 = eglu::getRenderableAPIsMask(egl,(this->super_GetProcAddressCase).m_display);
  funcNames.functions._3_1_ = (this->m_apiBit & ~uVar2) == 0;
  FVar4 = egl::anon_unknown_0::getCoreFunctionNames(this->m_apiBit);
  funcNames._0_8_ = FVar4.functions;
  local_68 = FVar4.numFunctions;
  tcu::TestLog::operator<<(&local_1e8,pTStack_18,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_1e8,(char (*) [33])"EGL_KHR_get_all_proc_addresses: ");
  local_1f0 = "not supported";
  if ((local_19 & 1) != 0) {
    local_1f0 = "supported";
  }
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1f0);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e8);
  tcu::TestLog::operator<<(&local_370,pTStack_18,(BeginMessageToken *)&tcu::TestLog::Message);
  tcu::MessageBuilder::operator<<(&local_370,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_370);
  if ((funcNames.functions._3_1_ & 1) == 0) {
    tcu::TestLog::operator<<(&local_4f0,pTStack_18,(BeginMessageToken *)&tcu::TestLog::Message);
    local_4f8 = eglu::getConfigAttribValueStr(0x3040,this->m_apiBit);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_4f0,&local_4f8);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [47])" not supported by any available configuration.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4f0);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_678,pTStack_18,(BeginMessageToken *)&tcu::TestLog::Message);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_678,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_678);
  }
  for (funcName._4_4_ = 0; funcName._4_4_ < local_68; funcName._4_4_ = funcName._4_4_ + 1) {
    funcPtr = *(_func_void **)(funcNames._0_8_ + (long)funcName._4_4_ * 8);
    local_690 = eglu::CallLogWrapper::eglGetProcAddress
                          (&(this->super_GetProcAddressCase).super_CallLogWrapper,(char *)funcPtr);
    err = eglu::CallLogWrapper::eglGetError(&(this->super_GetProcAddressCase).super_CallLogWrapper);
    eglu::checkError(err,"eglGetProcAddress()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetProcAddressTests.cpp"
                     ,0xff);
    if ((((funcNames.functions._3_1_ & 1) == 0) || ((local_19 & 1) == 0)) ||
       (local_690 != (__eglMustCastToProperFunctionPointerType)0x0)) {
      if (((funcNames.functions._3_1_ & 1) == 0) &&
         (local_690 != (__eglMustCastToProperFunctionPointerType)0x0)) {
        tcu::TestLog::operator<<(&local_990,pTStack_18,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar3 = tcu::MessageBuilder::operator<<
                           (&local_990,
                            (char (*) [60])
                            "Warning, received non-null value for unsupported function: ");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char **)&funcPtr);
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_990);
        tcu::TestContext::setTestResult
                  ((this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_QUALITY_WARNING,
                   "Non-null value for unsupported function");
      }
    }
    else {
      tcu::TestLog::operator<<(&local_810,pTStack_18,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_810,
                          (char (*) [53])"Fail, received null pointer for supported function: ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char **)&funcPtr);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_810);
      tcu::TestContext::setTestResult
                ((this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Unexpected null pointer");
    }
  }
  return;
}

Assistant:

void executeTest (void)
	{
		TestLog&				log					= m_testCtx.getLog();
		const bool				funcPtrSupported	= isSupported("EGL_KHR_get_all_proc_addresses");
		const bool				apiSupported		= (eglu::getRenderableAPIsMask(m_eglTestCtx.getLibrary(), m_display) & m_apiBit) == m_apiBit;
		const FunctionNames		funcNames			= getCoreFunctionNames(m_apiBit);

		log << TestLog::Message << "EGL_KHR_get_all_proc_addresses: " << (funcPtrSupported ? "supported" : "not supported") << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;

		if (!apiSupported)
		{
			log << TestLog::Message << eglu::getConfigAttribValueStr(EGL_RENDERABLE_TYPE, m_apiBit) << " not supported by any available configuration." << TestLog::EndMessage;
			log << TestLog::Message << TestLog::EndMessage;
		}

		for (int funcNdx = 0; funcNdx < funcNames.numFunctions; funcNdx++)
		{
			const char*	funcName			= funcNames.functions[funcNdx];
			void		(*funcPtr)(void);

			funcPtr = eglGetProcAddress(funcName);
			eglu::checkError(eglGetError(), "eglGetProcAddress()", __FILE__, __LINE__);

			if (apiSupported && funcPtrSupported && (funcPtr == 0))
			{
				log << TestLog::Message << "Fail, received null pointer for supported function: " << funcName << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected null pointer");
			}
			else if (!apiSupported && (funcPtr != 0))
			{
				log << TestLog::Message << "Warning, received non-null value for unsupported function: " << funcName << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Non-null value for unsupported function");
			}
		}
	}